

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

void __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::rotate
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,LinkType x,Dir dir)

{
  LinkType LVar1;
  LinkType LVar2;
  Dir in_EDX;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *in_RSI;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *in_RDI;
  LinkType pX;
  LinkType yDir;
  LinkType y;
  LinkType in_stack_ffffffffffffffa8;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *in_stack_ffffffffffffffb0;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *node;
  
  node = in_RSI;
  opposite(in_EDX);
  LVar1 = getChild(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,kLeft);
  LVar2 = getChild(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,kLeft);
  opposite(in_EDX);
  setChild(in_RDI,(LinkType)node,(Dir)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
           in_stack_ffffffffffffffa8);
  if (LVar2 != -1) {
    setParent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x65cec2);
  }
  LVar2 = getParent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  setParent(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x65ceea);
  if (LVar2 == -1) {
    *in_RDI->rootNode = LVar1;
    LVar2 = in_stack_ffffffffffffffa8;
    in_RSI = in_stack_ffffffffffffffb0;
  }
  else {
    getChild(in_RSI,LVar2,kLeft);
    setChild(in_RDI,(LinkType)node,(Dir)((ulong)in_RSI >> 0x20),LVar2);
  }
  setChild(in_RDI,(LinkType)node,(Dir)((ulong)in_RSI >> 0x20),LVar2);
  setParent(in_RSI,LVar2,0x65cf80);
  return;
}

Assistant:

void rotate(LinkType x, Dir dir) {
    LinkType y = getChild(x, opposite(dir));
    LinkType yDir = getChild(y, dir);
    setChild(x, opposite(dir), yDir);
    if (yDir != kNoLink) setParent(yDir, x);

    LinkType pX = getParent(x);
    setParent(y, pX);

    if (pX == kNoLink)
      rootNode = y;
    else
      setChild(pX, Dir((x != getChild(pX, dir)) ^ dir), y);

    setChild(y, dir, x);
    setParent(x, y);
  }